

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O3

void __thiscall
MOS::MOS6522::MOS6522<Commodore::Vic20::KeyboardVIA>::shift_out
          (MOS6522<Commodore::Vic20::KeyboardVIA> *this)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x1c;
  if ((bVar4 == 0x10) || ((this->super_MOS6522Storage).shift_bits_remaining_ != 0)) {
    bVar2 = (this->super_MOS6522Storage).registers_.shift;
    bVar5 = bVar2 >> 7;
    if (bVar4 != 0x10) {
      bVar5 = 0;
    }
    (this->super_MOS6522Storage).registers_.shift = bVar5 | bVar2 * '\x02';
    evaluate_cb2_output(this);
    piVar1 = &(this->super_MOS6522Storage).shift_bits_remaining_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      bVar3 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
      bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags | 4;
      (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
      bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f;
      if (bVar3 != (bVar4 != 0)) {
        (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar4 != 0;
        (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
        IRQDelegatePortHandler::set_interrupt_status
                  (&this->bus_handler_->super_IRQDelegatePortHandler,bVar4 != 0);
        return;
      }
    }
  }
  return;
}

Assistant:

void MOS6522<T>::shift_out() {
	const bool is_free_running = shift_mode() == ShiftMode::OutUnderT2FreeRunning;
	if(is_free_running || shift_bits_remaining_) {
		// Recirculate bits only if in free-running mode (?)
		const uint8_t incoming_bit = (registers_.shift >> 7) * is_free_running;
		registers_.shift = uint8_t(registers_.shift << 1) | incoming_bit;
		evaluate_cb2_output();

		--shift_bits_remaining_;
		if(!shift_bits_remaining_) {
			registers_.interrupt_flags |= InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		}
	}
}